

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void libcellml::buildMaps
               (ComponentEntityPtr *componentEntity,ComponentMap *componentMap,
               VariableMap *variableMap)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<libcellml::ComponentEntity> local_58 [2];
  undefined1 local_38 [8];
  ComponentPtr component;
  size_t i;
  VariableMap *variableMap_local;
  ComponentMap *componentMap_local;
  ComponentEntityPtr *componentEntity_local;
  
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar2 = std::
             __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ComponentEntity::componentCount(peVar2)
    ;
    if (p_Var3 <= _Var1._M_pi) break;
    peVar2 = std::
             __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    ComponentEntity::component((ComponentEntity *)local_38,(size_t)peVar2);
    buildMapsForComponentsVariables((ComponentPtr *)local_38,componentMap,variableMap);
    std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Component,void>
              (local_58,(shared_ptr<libcellml::Component> *)local_38);
    buildMaps(local_58,componentMap,variableMap);
    std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr(local_58);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_38)
    ;
    component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

void buildMaps(const ComponentEntityPtr &componentEntity, ComponentMap &componentMap, VariableMap &variableMap)
{
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        ComponentPtr component = componentEntity->component(i);
        buildMapsForComponentsVariables(component, componentMap, variableMap);
        buildMaps(component, componentMap, variableMap);
    }
}